

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::ShaderSource::~ShaderSource(ShaderSource *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderSource_0011c800;
  std::__cxx11::string::~string((string *)&this->source);
  return;
}

Assistant:

~ShaderSource		(void) {}